

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

void ImPlot::PlotShaded<unsigned_short>
               (char *label_id,unsigned_short *values,int count,double y_ref,double xscale,double x0
               ,int offset,int stride)

{
  bool bVar1;
  GetterYs<unsigned_short> getter1;
  GetterYRef getter2;
  GetterYs<unsigned_short> local_78;
  GetterYRef local_50;
  
  bVar1 = -INFINITY < y_ref;
  if (!bVar1) {
    GetPlotLimits((ImPlotLimits *)&local_78,-1);
    y_ref = local_78.XScale;
  }
  local_50.YRef = y_ref;
  if (y_ref >= INFINITY) {
    GetPlotLimits((ImPlotLimits *)&local_78,-1);
    local_50.YRef = local_78.X0;
  }
  if (count == 0) {
    local_78.Offset = 0;
  }
  else {
    local_78.Offset = (offset % count + count) % count;
  }
  local_78.Ys = values;
  local_78.Count = count;
  local_78.XScale = xscale;
  local_78.X0 = x0;
  local_78.Stride = stride;
  local_50.Count = count;
  local_50.XScale = xscale;
  local_50.X0 = x0;
  PlotShadedEx<ImPlot::GetterYs<unsigned_short>,ImPlot::GetterYRef>
            (label_id,&local_78,&local_50,y_ref < INFINITY && bVar1);
  return;
}

Assistant:

void PlotShaded(const char* label_id, const T* values, int count, double y_ref, double xscale, double x0, int offset, int stride) {
    bool fit2 = true;
    if (y_ref == -HUGE_VAL) {
        fit2 = false;
        y_ref = GetPlotLimits().Y.Min;
    }
    if (y_ref == HUGE_VAL) {
        fit2 = false;
        y_ref = GetPlotLimits().Y.Max;
    }
    GetterYs<T> getter1(values,count,xscale,x0,offset,stride);
    GetterYRef getter2(y_ref,count,xscale,x0);
    PlotShadedEx(label_id, getter1, getter2, fit2);
}